

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

int64_t av1_highbd_block_error_c
                  (tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz,int bd)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  
  if (block_size < 1) {
    lVar5 = 0;
    lVar1 = 0;
  }
  else {
    lVar2 = 0;
    lVar1 = 0;
    lVar5 = 0;
    do {
      lVar6 = (long)coeff[lVar2];
      lVar1 = lVar1 + (lVar6 - dqcoeff[lVar2]) * (lVar6 - dqcoeff[lVar2]);
      lVar5 = lVar5 + lVar6 * lVar6;
      lVar2 = lVar2 + 1;
    } while (block_size != lVar2);
  }
  bVar4 = (char)bd * '\x02' - 0x10;
  uVar3 = (ulong)((uint)(1 << (bVar4 & 0x1f)) >> 1);
  *ssz = lVar5 + uVar3 >> (bVar4 & 0x3f);
  return lVar1 + uVar3 >> (bVar4 & 0x3f);
}

Assistant:

int64_t av1_highbd_block_error_c(const tran_low_t *coeff,
                                 const tran_low_t *dqcoeff, intptr_t block_size,
                                 int64_t *ssz, int bd) {
  int i;
  int64_t error = 0, sqcoeff = 0;
  int shift = 2 * (bd - 8);
  int rounding = (1 << shift) >> 1;

  for (i = 0; i < block_size; i++) {
    const int64_t diff = coeff[i] - dqcoeff[i];
    error += diff * diff;
    sqcoeff += (int64_t)coeff[i] * (int64_t)coeff[i];
  }
  error = (error + rounding) >> shift;
  sqcoeff = (sqcoeff + rounding) >> shift;

  *ssz = sqcoeff;
  return error;
}